

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcG.c
# Opt level: O2

Cnf_Dat_t * Bmcg_ManAddNewCnf(Bmcg_Man_t *p,int f,int nFramesAdd)

{
  int Var;
  int iVar1;
  uint uVar2;
  abctime aVar3;
  Gia_Man_t *pGia;
  abctime aVar4;
  Cnf_Dat_t *pCVar5;
  undefined4 *__s;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  long lVar8;
  
  aVar3 = Abc_Clock();
  pGia = Bmcg_ManUnfold(p,f,nFramesAdd);
  aVar4 = Abc_Clock();
  p->timeUnf = p->timeUnf + (aVar4 - aVar3);
  if (pGia == (Gia_Man_t *)0x0) {
    pCVar5 = (Cnf_Dat_t *)0x0;
  }
  else {
    aVar3 = Abc_Clock();
    pCVar5 = (Cnf_Dat_t *)Mf_ManGenerateCnf(pGia,8,1,0,0,0);
    uVar7 = (ulong)pGia->nObjs;
    __s = (undefined4 *)malloc(uVar7 << 2);
    memset(__s,0xff,uVar7 << 2);
    *__s = 0;
    for (lVar8 = 1; lVar8 < (int)uVar7; lVar8 = lVar8 + 1) {
      pGVar6 = Gia_ManObj(pGia,(int)lVar8);
      if (pGVar6 == (Gia_Obj_t *)0x0) break;
      if ((0 < pCVar5->pObj2Count[lVar8]) || ((~*(uint *)pGVar6 & 0x9fffffff) == 0)) {
        iVar1 = Vec_IntEntry(&p->vFr2Sat,pGVar6->Value);
        if (iVar1 == -1) {
          uVar2 = pGVar6->Value;
          iVar1 = p->nSatVars;
          p->nSatVars = iVar1 + 1;
          Vec_IntWriteEntry(&p->vFr2Sat,uVar2,iVar1);
        }
        __s[lVar8] = iVar1;
      }
      uVar7 = (ulong)(uint)pGia->nObjs;
    }
    Gia_ManStop(pGia);
    for (lVar8 = 0; lVar8 < pCVar5->nLiterals; lVar8 = lVar8 + 1) {
      iVar1 = (*pCVar5->pClauses)[lVar8];
      if (iVar1 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x134,"int Abc_Lit2LitV(int *, int)");
      }
      uVar2 = Abc_Lit2Var(iVar1);
      Var = __s[uVar2];
      iVar1 = Abc_LitIsCompl(iVar1);
      iVar1 = Abc_Var2Lit(Var,iVar1);
      (*pCVar5->pClauses)[lVar8] = iVar1;
    }
    free(__s);
    aVar4 = Abc_Clock();
    p->timeCnf = p->timeCnf + (aVar4 - aVar3);
  }
  return pCVar5;
}

Assistant:

Cnf_Dat_t * Bmcg_ManAddNewCnf( Bmcg_Man_t * p, int f, int nFramesAdd )
{
    abctime clk = Abc_Clock();
    Gia_Man_t * pNew = Bmcg_ManUnfold( p, f, nFramesAdd );
    Cnf_Dat_t * pCnf;
    Gia_Obj_t * pObj; 
    int i, iVar, * pMap;
    p->timeUnf += Abc_Clock() - clk;
    if ( pNew == NULL )
        return NULL;
    clk = Abc_Clock();
    pCnf = (Cnf_Dat_t *) Mf_ManGenerateCnf( pNew, 8, 1, 0, 0, 0 );
    pMap = ABC_FALLOC( int, Gia_ManObjNum(pNew) );
    pMap[0] = 0;
    Gia_ManForEachObj1( pNew, pObj, i )
    {
        if ( pCnf->pObj2Count[i] <= 0 && !Gia_ObjIsCi(pObj) )
            continue;
        iVar = Vec_IntEntry( &p->vFr2Sat, pObj->Value );
        if ( iVar == -1 )
            Vec_IntWriteEntry( &p->vFr2Sat, pObj->Value, (iVar = p->nSatVars++) );
        pMap[i] = iVar;
    }
    Gia_ManStop( pNew );
    for ( i = 0; i < pCnf->nLiterals; i++ )
        pCnf->pClauses[0][i] = Abc_Lit2LitV( pMap, pCnf->pClauses[0][i] );
    ABC_FREE( pMap );
    p->timeCnf += Abc_Clock() - clk;
    return pCnf;
}